

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupStarting
          (RunContext *this,string *testSpec,size_t groupIndex,size_t groupsCount)

{
  pointer pIVar1;
  GroupInfo local_58;
  size_t local_28;
  size_t groupsCount_local;
  size_t groupIndex_local;
  string *testSpec_local;
  RunContext *this_local;
  
  local_28 = groupsCount;
  groupsCount_local = groupIndex;
  groupIndex_local = (size_t)testSpec;
  testSpec_local = (string *)this;
  pIVar1 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  GroupInfo::GroupInfo(&local_58,(string *)groupIndex_local,groupsCount_local,local_28);
  (*pIVar1->_vptr_IStreamingReporter[6])(pIVar1,&local_58);
  GroupInfo::~GroupInfo(&local_58);
  return;
}

Assistant:

void RunContext::testGroupStarting(std::string const& testSpec, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupStarting(GroupInfo(testSpec, groupIndex, groupsCount));
    }